

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::CompressedMaterialization::CompressAggregate
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  *this_00;
  CompressedMaterialization *this_01;
  ulong *puVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  pointer pBVar5;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var6;
  ColumnBinding binding_p;
  idx_t iVar7;
  undefined8 uVar8;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> uVar9;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> this_02;
  pointer this_03;
  LogicalAggregate *pLVar10;
  pointer pEVar11;
  BoundColumnRefExpression *pBVar12;
  iterator iVar13;
  reference pvVar14;
  type pEVar15;
  reference pvVar16;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *p_Var17;
  pointer pCVar18;
  BoundAggregateExpression *pBVar19;
  pointer pBVar20;
  type op_00;
  const_reference pvVar21;
  const_reference type_p;
  reference pvVar22;
  InternalException *pIVar23;
  ulong uVar24;
  pointer puVar25;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  BoundOrderByNode *order;
  ulong uVar26;
  pointer pBVar27;
  size_type __n;
  bool bVar28;
  pair<std::__detail::_Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_false,_true>,_bool>
  pVar29;
  initializer_list<unsigned_long> __l;
  CMBindingInfo binding_info;
  vector<duckdb::ColumnBinding,_true> bindings_out;
  vector<duckdb::ColumnBinding,_true> group_bindings;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  stored_group_stats;
  CompressedMaterializationInfo info;
  column_binding_set_t referenced_bindings;
  column_binding_set_t group_binding_set;
  undefined1 local_200 [16];
  CMBindingInfo local_1f0;
  undefined8 local_1b8;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> local_1b0;
  ulong local_1a8;
  vector<duckdb::ColumnBinding,_true> local_1a0;
  vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_188;
  void *local_170 [2];
  long local_160;
  uint local_158;
  undefined1 local_148 [16];
  pointer local_138;
  string local_128;
  CompressedMaterializationInfo local_108;
  undefined1 local_a0 [32];
  float local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  local_1b8 = op;
  local_1b0._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>)
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>)this;
  this_03 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(op);
  pLVar10 = LogicalOperator::Cast<duckdb::LogicalAggregate>(this_03);
  if ((ulong)(((long)(pLVar10->grouping_sets).
                     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     .
                     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pLVar10->grouping_sets).
                     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     .
                     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) < 2) {
    local_68._0_8_ = local_40 + 8;
    local_68._8_8_ = 1;
    local_68._16_16_ = (undefined1  [16])0x0;
    local_48 = 1.0;
    local_40 = (undefined1  [16])0x0;
    puVar25 = (pLVar10->groups).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pLVar10->groups).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar25 != puVar2) {
      local_200._8_8_ = &pLVar10->groups;
      do {
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar25);
        if ((pEVar11->super_BaseExpression).type == BOUND_COLUMN_REF) {
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar25);
          pBVar12 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                              (&pEVar11->super_BaseExpression);
          iVar13 = ::std::
                   _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_68,&pBVar12->binding);
          if (iVar13.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur !=
              (__node_type *)0x0) goto LAB_00c5f25f;
          local_108.binding_map._M_h._M_buckets = (__buckets_ptr)local_68;
          ::std::
          _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::ColumnBinding_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,true>>>>
                    ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_68,&pBVar12->binding,&local_108);
        }
        puVar25 = puVar25 + 1;
      } while (puVar25 != puVar2);
      puVar25 = (pLVar10->groups).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pLVar10->groups).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((puVar25 != puVar2) &&
         ((pLVar10->group_stats).
          super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pLVar10->group_stats).
          super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        local_a0._0_8_ = local_78 + 8;
        local_a0._8_8_ = 1;
        local_a0._16_16_ = (undefined1  [16])0x0;
        local_80 = 1.0;
        local_78 = (undefined1  [16])0x0;
        local_108.binding_map._M_h._M_buckets = (__buckets_ptr)0xffffffffffffffff;
        local_108.binding_map._M_h._M_bucket_count._0_4_ = 0xffffffff;
        local_108.binding_map._M_h._M_bucket_count._4_4_ = 0xffffffff;
        ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
                  (&local_188,(long)puVar2 - (long)puVar25 >> 3,(value_type *)&local_108,
                   (allocator_type *)(local_200 + 0x10));
        local_108.binding_map._M_h._M_buckets =
             (__buckets_ptr)((ulong)local_108.binding_map._M_h._M_buckets & 0xffffffffffffff00);
        ::std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_170,
                   (long)(pLVar10->groups).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pLVar10->groups).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_108,
                   (allocator_type *)(local_200 + 0x10));
        uVar8 = local_200._8_8_;
        local_148 = (undefined1  [16])0x0;
        local_138 = (pointer)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
        ::resize((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  *)local_148,
                 (long)(pLVar10->groups).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pLVar10->groups).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        if ((pLVar10->groups).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pLVar10->groups).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          this_00 = &pLVar10->group_stats;
          uVar26 = 0;
          this_01 = (CompressedMaterialization *)(local_200 + 0x10);
          local_1a8 = 0x800000000000003f;
          do {
            pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                    *)uVar8,uVar26);
            pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(pvVar14);
            if ((pEVar15->super_BaseExpression).type == BOUND_COLUMN_REF) {
              pBVar12 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                  (&pEVar15->super_BaseExpression);
              pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                                  ((vector<duckdb::ColumnBinding,_true> *)&local_188,uVar26);
              iVar7 = (pBVar12->binding).column_index;
              pvVar16->table_index = (pBVar12->binding).table_index;
              pvVar16->column_index = iVar7;
            }
            else {
              GetReferencedBindings(pEVar15,(column_binding_set_t *)local_a0);
              pvVar22 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                        ::operator[](this_00,uVar26);
              if ((pvVar22->
                  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
                  (BaseStatistics *)0x0) {
                (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0x11])(local_200,pEVar15);
                pvVar22 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                          ::operator[](this_00,uVar26);
                unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*(pvVar22);
                GetCompressExpression
                          (this_01,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)local_1b0._M_t.
                                      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                                      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>.
                                      _M_head_impl,(BaseStatistics *)local_200);
                if ((long *)local_200._0_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_200._0_8_ + 8))();
                }
                local_200._0_8_ = (long *)0x0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0.binding.table_index !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  uVar24 = (ulong)local_158 + (local_160 - (long)local_170[0]) * 8;
                  if (uVar24 <= uVar26) {
                    pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
                    local_108.binding_map._M_h._M_buckets =
                         &local_108.binding_map._M_h._M_before_begin._M_nxt;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_108,
                               "Attempted to access index %ld within vector of size %ld","");
                    InternalException::InternalException<unsigned_long,unsigned_long>
                              (pIVar23,(string *)&local_108,uVar26,uVar24);
                    __cxa_throw(pIVar23,&InternalException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  uVar24 = uVar26 + 0x3f;
                  if (-1 < (long)uVar26) {
                    uVar24 = uVar26;
                  }
                  puVar1 = (ulong *)((long)local_170[0] +
                                    (ulong)((uVar26 & local_1a8) < 0x8000000000000001) * 8 +
                                    ((long)uVar24 >> 6) * 8 + -8);
                  *puVar1 = *puVar1 | 1L << ((byte)uVar26 & 0x3f);
                  pvVar22 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                            ::operator[](this_00,uVar26);
                  p_Var17 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                             *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                               ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                             *)local_148,uVar26);
                  _Var6._M_head_impl =
                       (pvVar22->
                       super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
                  (pvVar22->
                  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                       (BaseStatistics *)0x0;
                  ::std::
                  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ::reset(p_Var17,_Var6._M_head_impl);
                  pCVar18 = unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                            ::operator->((unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                                          *)this_01);
                  pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                          *)uVar8,uVar26);
                  _Var3._M_head_impl =
                       (pCVar18->expression).
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                  (pCVar18->expression).
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false> =
                       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
                  _Var4._M_head_impl =
                       (pvVar14->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                  (pvVar14->
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                       _Var3._M_head_impl;
                  if (_Var4._M_head_impl != (Expression *)0x0) {
                    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
                  }
                  pCVar18 = unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                            ::operator->((unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                                          *)this_01);
                  p_Var17 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                             *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                               ::operator[](this_00,uVar26);
                  _Var6._M_head_impl =
                       (pCVar18->stats).
                       super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
                  (pCVar18->stats).
                  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                       (BaseStatistics *)0x0;
                  ::std::
                  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                  ::reset(p_Var17,_Var6._M_head_impl);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0.binding.table_index
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::default_delete<duckdb::CompressExpression>::operator()
                              ((default_delete<duckdb::CompressExpression> *)this_01,
                               (CompressExpression *)local_1f0.binding.table_index);
                  }
                }
              }
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 < (ulong)((long)(pLVar10->groups).
                                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pLVar10->groups).
                                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if ((pLVar10->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pLVar10->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_200._8_8_ = &(pLVar10->super_LogicalOperator).expressions;
          __n = 0;
          do {
            pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                    *)local_200._8_8_,__n);
            pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(pvVar14);
            pBVar19 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                                (&pEVar15->super_BaseExpression);
            puVar2 = (pBVar19->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar25 = (pBVar19->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar2;
                puVar25 = puVar25 + 1) {
              pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator*(puVar25);
              GetReferencedBindings(pEVar15,(column_binding_set_t *)local_a0);
            }
            if ((pBVar19->filter).
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (Expression *)0x0) {
              pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator*(&pBVar19->filter);
              GetReferencedBindings(pEVar15,(column_binding_set_t *)local_a0);
            }
            if ((pBVar19->order_bys).
                super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
                .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl !=
                (BoundOrderModifier *)0x0) {
              pBVar20 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                        ::operator->(&pBVar19->order_bys);
              pBVar5 = (pBVar20->orders).
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       .
                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pBVar27 = (pBVar20->orders).
                             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             .
                             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_start; pBVar27 != pBVar5;
                  pBVar27 = pBVar27 + 1) {
                pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator*(&pBVar27->expression);
                if ((pEVar15->super_BaseExpression).type != BOUND_COLUMN_REF) {
                  GetReferencedBindings(pEVar15,(column_binding_set_t *)local_a0);
                }
              }
            }
            __n = __n + 1;
          } while (__n < (ulong)((long)(pLVar10->super_LogicalOperator).expressions.
                                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pLVar10->super_LogicalOperator).expressions.
                                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b8);
        local_128._M_dataplus._M_p = (pointer)0x0;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_128;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_200 + 0x10),__l,
                   (allocator_type *)&local_1a0);
        CompressedMaterializationInfo::CompressedMaterializationInfo
                  (&local_108,op_00,(vector<unsigned_long,_true> *)(local_200 + 0x10),
                   (column_binding_set_t *)local_a0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0.binding.table_index !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete((void *)local_1f0.binding.table_index);
        }
        (*(pLVar10->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_1a0,pLVar10);
        if ((pLVar10->groups).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pLVar10->groups).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar26 = 0;
          do {
            pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[](&local_1a0,uVar26);
            binding_p.table_index = pvVar21->table_index;
            binding_p.column_index = pvVar21->column_index;
            type_p = vector<duckdb::LogicalType,_true>::operator[]
                               (&(pLVar10->super_LogicalOperator).types,uVar26);
            CMBindingInfo::CMBindingInfo((CMBindingInfo *)(local_200 + 0x10),binding_p,type_p);
            uVar24 = (ulong)local_158 + (local_160 - (long)local_170[0]) * 8;
            if (uVar24 <= uVar26) {
              pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,
                         "Attempted to access index %ld within vector of size %ld","");
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar23,&local_128,uVar26,uVar24);
              __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar24 = uVar26 + 0x3f;
            if (-1 < (long)uVar26) {
              uVar24 = uVar26;
            }
            bVar28 = (*(ulong *)((long)local_170[0] +
                                (ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                                ((long)uVar24 >> 6) * 8 + -8) & 1L << ((byte)uVar26 & 0x3f)) == 0;
            local_1f0.needs_decompression = !bVar28;
            if (bVar28) {
              pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                                  ((vector<duckdb::ColumnBinding,_true> *)&local_188,uVar26);
              if ((pvVar16->table_index != 0xffffffffffffffff) ||
                 (pvVar16->column_index != 0xffffffffffffffff)) {
                pvVar16 = vector<duckdb::ColumnBinding,_true>::operator[]
                                    ((vector<duckdb::ColumnBinding,_true> *)&local_188,uVar26);
                ::std::
                _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<duckdb::ColumnBinding&,duckdb::CMBindingInfo>
                          ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&local_108,pvVar16,local_200 + 0x10);
              }
            }
            else {
              pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[](&local_1a0,uVar26);
              pVar29 = ::std::
                       _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       ::_M_emplace<duckdb::ColumnBinding_const&,duckdb::CMBindingInfo>
                                 ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                   *)&local_108,pvVar21,local_200 + 0x10);
              pvVar22 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                      *)local_148,uVar26);
              _Var6._M_head_impl =
                   (pvVar22->
                   super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
              (pvVar22->
              super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
              .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                   (BaseStatistics *)0x0;
              ::std::
              __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
              ::reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       *)((long)pVar29.first.
                                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                         + 0x48),_Var6._M_head_impl);
            }
            uVar9.
            super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
                 local_1f0.stats;
            if (local_1f0.stats.
                super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
                 )0x0) {
              BaseStatistics::~BaseStatistics
                        ((BaseStatistics *)
                         local_1f0.stats.
                         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
              operator_delete((void *)uVar9.
                                      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                                      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>.
                                      _M_head_impl);
            }
            local_1f0.stats.
            super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
                 (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
                  )0x0;
            LogicalType::~LogicalType(&local_1f0.type);
            uVar26 = uVar26 + 1;
          } while (uVar26 < (ulong)((long)(pLVar10->groups).
                                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pLVar10->groups).
                                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        this_02._M_t.
        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
             (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>)
             (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>)
             local_1b0;
        uVar8 = local_1b8;
        CreateProjections((CompressedMaterialization *)
                          local_1b0._M_t.
                          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_1b8,&local_108);
        UpdateAggregateStats
                  ((CompressedMaterialization *)
                   this_02._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)uVar8);
        if (local_1a0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a0.
                          super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          .
                          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>::~vector
                  (&local_108.child_info.
                    super_vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>);
        if (local_108.child_idxs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.child_idxs.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::
        _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_108);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                   *)local_148);
        if (local_170[0] != (void *)0x0) {
          operator_delete(local_170[0]);
        }
        if (local_188.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.
                          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::
        _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_a0);
      }
    }
LAB_00c5f25f:
    ::std::
    _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_68);
  }
  return;
}

Assistant:

void CompressedMaterialization::CompressAggregate(unique_ptr<LogicalOperator> &op) {
	auto &aggregate = op->Cast<LogicalAggregate>();
	if (aggregate.grouping_sets.size() > 1) {
		return; // FIXME: we should be able to compress here but for some reason the NULL statistics ain't right
	}
	auto &groups = aggregate.groups;
	column_binding_set_t group_binding_set;
	for (const auto &group : groups) {
		if (group->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			continue;
		}
		auto &colref = group->Cast<BoundColumnRefExpression>();
		if (group_binding_set.find(colref.binding) != group_binding_set.end()) {
			return; // Duplicate group - don't compress
		}
		group_binding_set.insert(colref.binding);
	}
	auto &group_stats = aggregate.group_stats;

	// No need to compress if there are no groups/stats
	if (groups.empty() || group_stats.empty()) {
		return;
	}
	D_ASSERT(groups.size() == group_stats.size());

	// Find all bindings referenced by non-colref expressions in the groups
	// These are excluded from compression by projection
	// But we can try to compress the expression directly
	column_binding_set_t referenced_bindings;
	vector<ColumnBinding> group_bindings(groups.size(), ColumnBinding());
	vector<bool> needs_decompression(groups.size(), false);
	vector<unique_ptr<BaseStatistics>> stored_group_stats;
	stored_group_stats.resize(groups.size());
	for (idx_t group_idx = 0; group_idx < groups.size(); group_idx++) {
		auto &group_expr = *groups[group_idx];
		if (group_expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
			auto &colref = group_expr.Cast<BoundColumnRefExpression>();
			group_bindings[group_idx] = colref.binding;
			continue; // Will be compressed generically
		}

		// Mark the bindings referenced by the non-colref expression so they won't be modified
		GetReferencedBindings(group_expr, referenced_bindings);

		// The non-colref expression won't be compressed generically, so try to compress it here
		if (!group_stats[group_idx]) {
			continue; // Can't compress without stats
		}

		// Try to compress, if successful, replace the expression
		auto compress_expr = GetCompressExpression(group_expr.Copy(), *group_stats[group_idx]);
		if (compress_expr) {
			needs_decompression[group_idx] = true;
			stored_group_stats[group_idx] = std::move(group_stats[group_idx]);
			groups[group_idx] = std::move(compress_expr->expression);
			group_stats[group_idx] = std::move(compress_expr->stats);
		}
	}

	// Anything referenced in the aggregate functions is also excluded
	for (idx_t expr_idx = 0; expr_idx < aggregate.expressions.size(); expr_idx++) {
		const auto &expr = *aggregate.expressions[expr_idx];
		D_ASSERT(expr.GetExpressionType() == ExpressionType::BOUND_AGGREGATE);
		const auto &aggr_expr = expr.Cast<BoundAggregateExpression>();
		for (const auto &child : aggr_expr.children) {
			GetReferencedBindings(*child, referenced_bindings);
		}
		if (aggr_expr.filter) {
			GetReferencedBindings(*aggr_expr.filter, referenced_bindings);
		}
		if (aggr_expr.order_bys) {
			for (const auto &order : aggr_expr.order_bys->orders) {
				const auto &order_expr = *order.expression;
				if (order_expr.GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
					GetReferencedBindings(order_expr, referenced_bindings);
				}
			}
		}
	}

	// Create info for compression
	CompressedMaterializationInfo info(*op, {0}, referenced_bindings);

	// Create binding mapping
	const auto bindings_out = aggregate.GetColumnBindings();
	const auto &types = aggregate.types;
	for (idx_t group_idx = 0; group_idx < groups.size(); group_idx++) {
		// Aggregate changes bindings as it has a table idx
		CMBindingInfo binding_info(bindings_out[group_idx], types[group_idx]);
		binding_info.needs_decompression = needs_decompression[group_idx];
		if (needs_decompression[group_idx]) {
			// Compressed non-generically
			auto entry = info.binding_map.emplace(bindings_out[group_idx], std::move(binding_info));
			entry.first->second.stats = std::move(stored_group_stats[group_idx]);
		} else if (group_bindings[group_idx] != ColumnBinding()) {
			info.binding_map.emplace(group_bindings[group_idx], std::move(binding_info));
		}
	}

	// Now try to compress
	CreateProjections(op, info);

	// Update aggregate statistics
	UpdateAggregateStats(op);
}